

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O0

void __thiscall
pmx::PmxVertexSkinningBDEF4::Read(PmxVertexSkinningBDEF4 *this,istream *stream,PmxSetting *setting)

{
  int iVar1;
  PmxSetting *setting_local;
  istream *stream_local;
  PmxVertexSkinningBDEF4 *this_local;
  
  iVar1 = ReadIndex(stream,(uint)setting->bone_index_size);
  this->bone_index1 = iVar1;
  iVar1 = ReadIndex(stream,(uint)setting->bone_index_size);
  this->bone_index2 = iVar1;
  iVar1 = ReadIndex(stream,(uint)setting->bone_index_size);
  this->bone_index3 = iVar1;
  iVar1 = ReadIndex(stream,(uint)setting->bone_index_size);
  this->bone_index4 = iVar1;
  std::istream::read((char *)stream,(long)&this->bone_weight1);
  std::istream::read((char *)stream,(long)&this->bone_weight2);
  std::istream::read((char *)stream,(long)&this->bone_weight3);
  std::istream::read((char *)stream,(long)&this->bone_weight4);
  return;
}

Assistant:

void PmxVertexSkinningBDEF4::Read(std::istream *stream, PmxSetting *setting)
	{
		this->bone_index1 = ReadIndex(stream, setting->bone_index_size);
		this->bone_index2 = ReadIndex(stream, setting->bone_index_size);
		this->bone_index3 = ReadIndex(stream, setting->bone_index_size);
		this->bone_index4 = ReadIndex(stream, setting->bone_index_size);
		stream->read((char*) &this->bone_weight1, sizeof(float));
		stream->read((char*) &this->bone_weight2, sizeof(float));
		stream->read((char*) &this->bone_weight3, sizeof(float));
		stream->read((char*) &this->bone_weight4, sizeof(float));
	}